

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O0

string * duckdb::Base64Decode(string *key)

{
  idx_t iVar1;
  pointer puVar2;
  string *in_RDI;
  anon_union_16_2_67f50693_for_value in_stack_00000010;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> output;
  idx_t result_size;
  string *decoded_key;
  uchar *in_stack_ffffffffffffff88;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  allocator *paVar3;
  string *output_size;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  anon_union_16_2_67f50693_for_value in_stack_ffffffffffffffb8;
  
  output_size = in_RDI;
  string_t::string_t((string_t *)in_RDI,in_stack_ffffffffffffff98);
  iVar1 = Blob::FromBase64Size((string_t)in_stack_00000010);
  operator_new__(iVar1);
  unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>,true>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  string_t::string_t((string_t *)in_RDI,in_stack_ffffffffffffff98);
  ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
            (in_stack_ffffffffffffff90);
  Blob::FromBase64((string_t)in_stack_ffffffffffffffb8,
                   (data_ptr_t)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (idx_t)output_size);
  puVar2 = ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (in_stack_ffffffffffffff90);
  paVar3 = (allocator *)&stack0xffffffffffffffb2;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)in_RDI,(char *)puVar2,iVar1,paVar3);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb2);
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> *)0x2320f15);
  return output_size;
}

Assistant:

string Base64Decode(const string &key) {
	auto result_size = Blob::FromBase64Size(key);
	auto output = duckdb::unique_ptr<unsigned char[]>(new unsigned char[result_size]);
	Blob::FromBase64(key, output.get(), result_size);
	string decoded_key(reinterpret_cast<const char *>(output.get()), result_size);
	return decoded_key;
}